

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_3983::test_minimum(void **param_1)

{
  roaring64_bitmap_t *r;
  uint64_t uVar1;
  
  r = roaring64_bitmap_create();
  uVar1 = roaring64_bitmap_minimum(r);
  _assert_int_equal(uVar1,0xffffffffffffffff,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x2ec);
  roaring64_bitmap_add(r,0x400000001);
  roaring64_bitmap_add(r,0x800000001);
  roaring64_bitmap_add(r,0x800000002);
  uVar1 = roaring64_bitmap_minimum(r);
  _assert_int_equal(uVar1,0x400000001,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x2f2);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_minimum) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    assert_int_equal(roaring64_bitmap_minimum(r), UINT64_MAX);

    roaring64_bitmap_add(r, (1ULL << 34) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 2);

    assert_int_equal(roaring64_bitmap_minimum(r), ((1ULL << 34) + 1));

    roaring64_bitmap_free(r);
}